

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O2

void __thiscall btLCP::pN_plusequals_ANi(btLCP *this,btScalar *p,int i,int sign)

{
  btScalar *pbVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  lVar4 = (long)this->m_nC;
  pbVar1 = this->m_A[i];
  uVar3 = 0;
  if (0 < this->m_nN) {
    uVar3 = (ulong)(uint)this->m_nN;
  }
  if (sign < 1) {
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      p[lVar4 + uVar2] = p[lVar4 + uVar2] - pbVar1[lVar4 + uVar2];
    }
  }
  else {
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      p[lVar4 + uVar2] = pbVar1[lVar4 + uVar2] + p[lVar4 + uVar2];
    }
  }
  return;
}

Assistant:

void btLCP::pN_plusequals_ANi (btScalar *p, int i, int sign)
{
  const int nC = m_nC;
  btScalar *aptr = BTAROW(i) + nC;
  btScalar *ptgt = p + nC;
  if (sign > 0) {
    const int nN = m_nN;
    for (int j=0; j<nN; ++j) ptgt[j] += aptr[j];
  }
  else {
    const int nN = m_nN;
    for (int j=0; j<nN; ++j) ptgt[j] -= aptr[j];
  }
}